

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O1

QRegion __thiscall QRegion::united(QRegion *this,QRect *r)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  QRect *in_RDX;
  int *piVar7;
  long in_FS_OFFSET;
  QRegionPrivate rp;
  QRegionPrivate local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  piVar6 = *(int **)(*(long *)r + 8);
  if ((piVar6 == (int *)0x0) || (*piVar6 == 0)) {
LAB_0043155e:
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_004316d5;
    QRegion(this,in_RDX,Rectangle);
  }
  else {
    iVar1 = (in_RDX->x1).m_i;
    iVar2 = (in_RDX->y1).m_i;
    iVar3 = (in_RDX->x2).m_i;
    iVar4 = (in_RDX->y2).m_i;
    if ((iVar2 <= iVar4 && iVar1 <= iVar3) &&
       ((((iVar1 < piVar6[0xc] || (piVar6[0xe] < iVar3)) || (iVar2 < piVar6[0xd])) ||
        (piVar6[0xf] < iVar4)))) {
      if (((iVar1 <= piVar6[8]) && (piVar6[10] <= iVar3)) &&
         ((iVar2 <= piVar6[9] && (piVar6[0xb] <= iVar4)))) goto LAB_0043155e;
      iVar5 = *piVar6;
      if (((piVar6[8] != iVar1 || iVar5 != 1) || (piVar6[10] != iVar3)) ||
         ((piVar6[9] != iVar2 || (piVar6[0xb] != iVar4)))) {
        piVar7 = *(int **)(piVar6 + 4) + (long)iVar5 * 4 + -4;
        if (iVar5 == 1) {
          piVar7 = piVar6 + 8;
        }
        if ((piVar7[3] < iVar2) ||
           (((iVar2 == piVar7[1] && (iVar4 - iVar2 == piVar7[3] - piVar7[1])) && (piVar7[2] < iVar1)
            ))) {
          this->d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
          QRegion(this,(QRegion *)r);
          detach(this);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            QRegionPrivate::append(this->d->qt_rgn,in_RDX);
            return (QRegion)(QRegionData *)this;
          }
        }
        else {
          piVar7 = *(int **)(piVar6 + 4);
          if (iVar5 == 1) {
            piVar7 = piVar6 + 8;
          }
          iVar1 = piVar7[1];
          if ((iVar4 < iVar1) ||
             (((iVar2 == iVar1 && (iVar4 - iVar2 == piVar7[3] - iVar1)) && (iVar3 < *piVar7)))) {
            this->d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
            QRegion(this,(QRegion *)r);
            detach(this);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              QRegionPrivate::prepend(this->d->qt_rgn,in_RDX);
              return (QRegion)(QRegionData *)this;
            }
          }
          else {
            this->d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
            QRegion(this);
            detach(this);
            local_78.innerArea =
                 (((in_RDX->y2).m_i - (in_RDX->y1).m_i) + 1) *
                 (((in_RDX->x2).m_i - (in_RDX->x1).m_i) + 1);
            local_78.numRects = 1;
            local_78.rects.d.d = (Data *)0x0;
            local_78.rects.d.ptr = (QRect *)0x0;
            local_78.rects.d.size = 0;
            local_78.extents.x1.m_i = (in_RDX->x1).m_i;
            local_78.extents.y1.m_i = (in_RDX->y1).m_i;
            local_78.extents.x2.m_i = (in_RDX->x2).m_i;
            local_78.extents.y2.m_i = (in_RDX->y2).m_i;
            local_78.innerRect.x1.m_i = (in_RDX->x1).m_i;
            local_78.innerRect.y1.m_i = (in_RDX->y1).m_i;
            local_78.innerRect.x2.m_i = (in_RDX->x2).m_i;
            local_78.innerRect.y2.m_i = (in_RDX->y2).m_i;
            UnionRegion(*(QRegionPrivate **)(*(long *)r + 8),&local_78,this->d->qt_rgn);
            if (&(local_78.rects.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_78.rects.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_78.rects.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                   _M_i + -1;
              UNLOCK();
              if (((local_78.rects.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                  _M_i == 0) {
                QArrayData::deallocate(&(local_78.rects.d.d)->super_QArrayData,0x10,0x10);
              }
            }
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              return (QRegion)(QRegionData *)this;
            }
          }
        }
        goto LAB_004316d5;
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_004316d5:
      __stack_chk_fail();
    }
    QRegion(this,(QRegion *)r);
  }
  return (QRegion)(QRegionData *)this;
}

Assistant:

QRegion QRegion::united(const QRect &r) const
{
    if (isEmptyHelper(d->qt_rgn))
        return r;
    if (r.isEmpty())
        return *this;

    if (d->qt_rgn->contains(r)) {
        return *this;
    } else if (d->qt_rgn->within(r)) {
        return r;
    } else if (d->qt_rgn->numRects == 1 && d->qt_rgn->extents == r) {
        return *this;
    } else if (d->qt_rgn->canAppend(&r)) {
        QRegion result(*this);
        result.detach();
        result.d->qt_rgn->append(&r);
        return result;
    } else if (d->qt_rgn->canPrepend(&r)) {
        QRegion result(*this);
        result.detach();
        result.d->qt_rgn->prepend(&r);
        return result;
    } else {
        QRegion result;
        result.detach();
        QRegionPrivate rp(r);
        UnionRegion(d->qt_rgn, &rp, *result.d->qt_rgn);
        return result;
    }
}